

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::UniformLocTypesStructs::Run(UniformLocTypesStructs *this)

{
  long lVar1;
  DefOccurence local_760;
  DefOccurence local_75c;
  LayoutSpecifierBase local_758;
  LayoutSpecifierBase local_748;
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  local_738;
  UniformType local_720;
  Uniform local_690;
  LayoutSpecifierBase local_4b8;
  DefOccurence local_4a8;
  DefOccurence local_4a4;
  LayoutSpecifierBase local_4a0;
  LayoutSpecifierBase local_490;
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  local_480;
  UniformType local_468;
  Uniform local_3d8;
  undefined1 local_200 [8];
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  UniformType local_158;
  UniformType local_b8;
  undefined1 local_28 [8];
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  members;
  UniformLocTypesStructs *this_local;
  
  members.
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::vector((vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
            *)local_28);
  UniformType::UniformType(&local_b8,0x8b52,0);
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::push_back((vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
               *)local_28,&local_b8);
  UniformType::~UniformType(&local_b8);
  UniformType::UniformType(&local_158,0x1406,2);
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::push_back((vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
               *)local_28,&local_158);
  UniformType::~UniformType(&local_158);
  UniformType::UniformType
            ((UniformType *)
             &uniforms.
              super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0x8b5a,0);
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::push_back((vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
               *)local_28,
              (value_type *)
              &uniforms.
               super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  UniformType::~UniformType
            ((UniformType *)
             &uniforms.
              super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            *)local_200);
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::vector(&local_480,
           (vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
            *)local_28);
  UniformType::UniformType
            (&local_468,&(this->super_ExplicitUniformLocationCaseBase).uniformStructCounter,
             &local_480,3);
  local_4a0 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(1,Dec);
  local_490 = local_4a0;
  DefOccurence::DefOccurence(&local_4a4,ALL_SH);
  DefOccurence::DefOccurence(&local_4a8,ALL_SH);
  local_4b8 = local_490;
  anon_unknown_0::Uniform::Uniform
            (&local_3d8,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_468,(Loc)local_490,local_4a4,local_4a8);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_200,&local_3d8);
  anon_unknown_0::Uniform::~Uniform(&local_3d8);
  UniformType::~UniformType(&local_468);
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&local_480);
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::vector(&local_738,
           (vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
            *)local_28);
  UniformType::UniformType
            (&local_720,&(this->super_ExplicitUniformLocationCaseBase).uniformStructCounter,
             &local_738,0);
  local_758 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(0xd,Dec);
  local_748 = local_758;
  DefOccurence::DefOccurence(&local_75c,ALL_SH);
  DefOccurence::DefOccurence(&local_760,ALL_SH);
  anon_unknown_0::Uniform::Uniform
            (&local_690,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_720,(Loc)local_748,local_75c,local_760);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_200,&local_690);
  anon_unknown_0::Uniform::~Uniform(&local_690);
  UniformType::~UniformType(&local_720);
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&local_738);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_200);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             *)local_200);
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector((vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
             *)local_28);
  return lVar1;
}

Assistant:

virtual long Run()
	{

		/**
		 * This test case uses following uniform declarations:
		 *
		 * struct S {
		 *   vec4  u0;
		 *   float u1[2];
		 *   mat2  u2;
		 * };
		 * layout (location = 1) uniform S s0[3];
		 * layout (location = 13) uniform S s1;
		 */

		std::vector<UniformType> members;
		members.push_back(GL_FLOAT_VEC4);
		members.push_back(UniformType(GL_FLOAT, 2));
		members.push_back(GL_FLOAT_MAT2);
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(uniformStructCounter, members, 3), Loc::C(1)));
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(uniformStructCounter, members), Loc::C(13)));
		return doRun(uniforms);
	}